

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

mat4 * mat4_rotation_x(mat4 *__return_storage_ptr__,float theta)

{
  float f;
  float j;
  float s;
  float c;
  float theta_local;
  
  f = cosf(theta);
  j = sinf(theta);
  mat4_create(__return_storage_ptr__,1.0,0.0,0.0,0.0,0.0,f,-j,0.0,0.0,j,f,0.0,0.0,0.0,0.0,1.0);
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_rotation_x(float theta) {
    float c = cosf(theta);
    float s = sinf(theta);
    return mat4_create(
            1.0f, 0.0f, 0.0f, 0.0f,
            0.0f, c, -s, 0.0f,
            0.0f, s, c, 0.0f,
            0.0f, 0.0f, 0.0f, 1.0f);
}